

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

bool __thiscall
dxil_spv::Converter::Impl::emit_execution_modes_ray_tracing(Impl *this,ExecutionModel model)

{
  Builder *this_00;
  Builder *builder;
  ExecutionModel model_local;
  Impl *this_local;
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addCapability(this_00,CapabilityRayTracingKHR);
  if ((((this->options).ray_tracing_primitive_culling_enabled & 1U) != 0) &&
     (((this->shader_analysis).can_require_primitive_culling & 1U) != 0)) {
    spv::Builder::addCapability(this_00,CapabilityRayTraversalPrimitiveCullingKHR);
  }
  if ((((this->options).opacity_micromap_enabled & 1U) != 0) &&
     (((this->shader_analysis).can_require_opacity_micromap & 1U) != 0)) {
    spv::Builder::addCapability(this_00,CapabilityRayTracingOpacityMicromapEXT);
    spv::Builder::addExtension(this_00,"SPV_EXT_opacity_micromap");
  }
  spv::Builder::addExtension(this_00,"SPV_KHR_ray_tracing");
  spv::Builder::addExtension(this_00,"SPV_EXT_descriptor_indexing");
  spv::Builder::addCapability(this_00,CapabilityRuntimeDescriptorArray);
  spv::Builder::addCapability(this_00,CapabilitySampledImageArrayDynamicIndexing);
  spv::Builder::addCapability(this_00,CapabilitySampledImageArrayNonUniformIndexing);
  spv::Builder::addCapability(this_00,CapabilityStorageImageArrayDynamicIndexing);
  spv::Builder::addCapability(this_00,CapabilityStorageImageArrayNonUniformIndexing);
  spv::Builder::addCapability(this_00,CapabilityStorageBufferArrayDynamicIndexing);
  spv::Builder::addCapability(this_00,CapabilityStorageBufferArrayNonUniformIndexing);
  spv::Builder::addCapability(this_00,CapabilityUniformBufferArrayDynamicIndexing);
  spv::Builder::addCapability(this_00,CapabilityUniformBufferArrayNonUniformIndexing);
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_ray_tracing(spv::ExecutionModel model)
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityRayTracingKHR);
	if (options.ray_tracing_primitive_culling_enabled && shader_analysis.can_require_primitive_culling)
		builder.addCapability(spv::CapabilityRayTraversalPrimitiveCullingKHR);
	if (options.opacity_micromap_enabled && shader_analysis.can_require_opacity_micromap)
	{
		builder.addCapability(spv::CapabilityRayTracingOpacityMicromapEXT);
		builder.addExtension("SPV_EXT_opacity_micromap");
	}
	builder.addExtension("SPV_KHR_ray_tracing");
	builder.addExtension("SPV_EXT_descriptor_indexing");

	// For DXR, we'll need full bindless.
	builder.addCapability(spv::CapabilityRuntimeDescriptorArrayEXT);

	builder.addCapability(spv::CapabilitySampledImageArrayDynamicIndexing);
	builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexing);
	builder.addCapability(spv::CapabilityStorageImageArrayDynamicIndexing);
	builder.addCapability(spv::CapabilityStorageImageArrayNonUniformIndexing);
	builder.addCapability(spv::CapabilityStorageBufferArrayDynamicIndexing);
	builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
	builder.addCapability(spv::CapabilityUniformBufferArrayDynamicIndexing);
	builder.addCapability(spv::CapabilityUniformBufferArrayNonUniformIndexing);

	return true;
}